

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::SpreadVolatileSemantics::VisitLoadsOfPointersToVariableInEntries
          (SpreadVolatileSemantics *this,uint32_t var_id,
          function<bool_(spvtools::opt::Instruction_*)> *handle_load,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *function_ids)

{
  initializer_list<unsigned_int> __l;
  uint32_t id;
  DefUseManager *this_00;
  bool bVar1;
  IRContext *this_01;
  reference pvVar2;
  anon_class_64_5_87920f08 local_d0;
  function<bool_(spvtools::opt::Instruction_*)> local_90;
  byte local_6d;
  uint32_t local_6c;
  bool finish_traversal;
  DefUseManager *pDStack_68;
  uint32_t ptr_id;
  DefUseManager *def_use_mgr;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> worklist;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *function_ids_local;
  function<bool_(spvtools::opt::Instruction_*)> *handle_load_local;
  uint32_t var_id_local;
  SpreadVolatileSemantics *this_local;
  
  local_58 = (iterator)((long)&def_use_mgr + 4);
  local_50 = 1;
  def_use_mgr._4_4_ = var_id;
  worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)function_ids;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&def_use_mgr + 3));
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,__l,
             (allocator_type *)((long)&def_use_mgr + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&def_use_mgr + 3));
  this_01 = Pass::context(&this->super_Pass);
  pDStack_68 = IRContext::get_def_use_mgr(this_01);
  do {
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local._7_1_ = true;
      goto LAB_00839bfc;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    local_6c = *pvVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    this_00 = pDStack_68;
    id = local_6c;
    local_d0.worklist = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48;
    local_d0.ptr_id = &local_6c;
    local_d0.this = this;
    std::function<bool_(spvtools::opt::Instruction_*)>::function(&local_d0.handle_load,handle_load);
    local_d0.function_ids =
         (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *)worklist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::function<bool(spvtools::opt::Instruction*)>::
    function<spvtools::opt::SpreadVolatileSemantics::VisitLoadsOfPointersToVariableInEntries(unsigned_int,std::function<bool(spvtools::opt::Instruction*)>const&,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>const&)::__0,void>
              ((function<bool(spvtools::opt::Instruction*)> *)&local_90,&local_d0);
    bVar1 = analysis::DefUseManager::WhileEachUser(this_00,id,&local_90);
    std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_90);
    VisitLoadsOfPointersToVariableInEntries(unsigned_int,std::function<bool(spvtools::opt::Instruction*)>const&,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>const&)
    ::$_0::~__0((__0 *)&local_d0);
    local_6d = (bVar1 ^ 0xffU) & 1;
  } while (local_6d == 0);
  this_local._7_1_ = false;
LAB_00839bfc:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return this_local._7_1_;
}

Assistant:

bool SpreadVolatileSemantics::VisitLoadsOfPointersToVariableInEntries(
    uint32_t var_id, const std::function<bool(Instruction*)>& handle_load,
    const std::unordered_set<uint32_t>& function_ids) {
  std::vector<uint32_t> worklist({var_id});
  auto* def_use_mgr = context()->get_def_use_mgr();
  while (!worklist.empty()) {
    uint32_t ptr_id = worklist.back();
    worklist.pop_back();
    bool finish_traversal = !def_use_mgr->WhileEachUser(
        ptr_id, [this, &worklist, &ptr_id, handle_load,
                 &function_ids](Instruction* user) {
          BasicBlock* block = context()->get_instr_block(user);
          if (block == nullptr ||
              function_ids.find(block->GetParent()->result_id()) ==
                  function_ids.end()) {
            return true;
          }

          if (user->opcode() == spv::Op::OpAccessChain ||
              user->opcode() == spv::Op::OpInBoundsAccessChain ||
              user->opcode() == spv::Op::OpPtrAccessChain ||
              user->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
              user->opcode() == spv::Op::OpCopyObject) {
            if (ptr_id == user->GetSingleWordInOperand(0))
              worklist.push_back(user->result_id());
            return true;
          }

          if (user->opcode() != spv::Op::OpLoad) {
            return true;
          }

          return handle_load(user);
        });
    if (finish_traversal) return false;
  }
  return true;
}